

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O2

bool __thiscall
SocketClient::writeTo(SocketClient *this,String *host,uint16_t port,uchar *f_data,uint size)

{
  Buffer *this_00;
  element_type *peVar1;
  int iVar2;
  ulong uVar3;
  ssize_t sVar4;
  int *piVar5;
  ulong uVar6;
  size_t __n;
  SharedPtr *pSVar7;
  size_t sVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  int e;
  SharedPtr loop;
  uint local_e4;
  Log local_c0;
  Resolver resolver;
  char local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  Log local_80;
  Log local_70;
  SharedPtr socketPtr;
  Log local_50;
  Log local_40;
  
  if ((size == 0) == (f_data != (uchar *)0x0)) {
    __assert_fail("(!size) == (!data)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                  ,0x1b1,
                  "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                 );
  }
  std::__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SocketClient,void>
            ((__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2> *)&socketPtr,
             (__weak_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2> *)this);
  Resolver::Resolver(&resolver);
  if (port != 0) {
    Resolver::resolve(&resolver,host,port,&socketPtr);
  }
  local_e4 = 0;
  if (this->mWriteWait == false) {
    this_00 = &this->mWriteBuffer;
    sVar8 = (this->mWriteBuffer).bufferSize;
    if (sVar8 != 0) {
      uVar3 = sVar8 - this->mWriteOffset;
      uVar9 = 0;
      while( true ) {
        uVar6 = (ulong)uVar9;
        __n = uVar3 - uVar6;
        if (uVar3 < uVar6 || __n == 0) break;
        if ((this->mWriteBuffer).bufferSize <= uVar6) {
          __assert_fail("mWriteBuffer.size() > total",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x1c6,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
        if (resolver.addr == (sockaddr *)0x0) {
          do {
            sVar4 = ::write(this->mFd,(this->mWriteBuffer).bufferData + this->mWriteOffset + uVar6,
                            __n);
            iVar2 = (int)sVar4;
            e = iVar2;
            if (iVar2 != -1) goto LAB_0018231a;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
        }
        else {
          do {
            sVar4 = sendto(this->mFd,(this->mWriteBuffer).bufferData + this->mWriteOffset + uVar6,
                           __n,0x4000,(sockaddr *)resolver.addr,(socklen_t)resolver.size);
            iVar2 = (int)sVar4;
            e = iVar2;
            if (iVar2 != -1) goto LAB_0018231a;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
        }
        iVar2 = -1;
LAB_0018231a:
        if (this->mLogsEnabled == true) {
          debug();
          Log::operator<<(&local_80,local_90);
          Log::addStringStream<unsigned_long>(&local_70,(unsigned_long)&local_80);
          Log::operator<<(&local_c0,(char *)&local_70);
          Log::addStringStream<int>((Log *)&loop,(int)&local_c0);
          __errno_location();
          Log::addStringStream<int>(&local_40,(int)(Log *)&loop);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_c0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
          iVar2 = e;
        }
        if (iVar2 == -1) {
          piVar5 = __errno_location();
          if (*piVar5 != 0xb) {
            std::__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<SocketClient,void>
                      ((__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2> *)&loop,
                       (__weak_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2> *)this);
            local_c0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
                 5;
            pSVar7 = &loop;
            Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
            operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                        *)&this->mSignalError,(shared_ptr<SocketClient> *)pSVar7,(Error *)&local_c0)
            ;
            iVar2 = (int)pSVar7;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            close(this,iVar2);
            goto LAB_0018257c;
          }
          if (this->mWMode == Synchronous) {
            EventLoop::eventLoop();
            if (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              if (uVar9 != 0) {
                this->mWriteOffset = this->mWriteOffset + uVar6;
              }
              uVar9 = EventLoop::processSocket
                                (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,this->mFd,-1);
              if ((uVar9 & 2) != 0) {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                goto LAB_0018251a;
              }
              uVar9 = 0;
              if (this->mFd == -1) {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                goto LAB_0018257c;
              }
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
          if (this->mWriteWait == true) {
            __assert_fail("!mWriteWait",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                          ,0x1e1,
                          "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                         );
          }
          EventLoop::eventLoop();
          if (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            EventLoop::updateSocket
                      (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       this->mFd,7);
            this->mWriteWait = true;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          break;
        }
        Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>>::operator()
                  ((Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                   &this->mSignalBytesWritten,&socketPtr,&e);
        uVar9 = uVar9 + e;
      }
      if (uVar9 != 0) {
        uVar6 = (ulong)uVar9;
        if (uVar3 < uVar6) {
          __assert_fail("total <= writeBufferSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x1f2,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
        if (uVar6 < uVar3) {
          this->mWriteOffset = this->mWriteOffset + uVar6;
        }
        else {
          this->mWriteOffset = 0;
          Buffer::clear(this_00);
        }
      }
    }
LAB_0018251a:
    bVar10 = this->mFd == -1;
    bVar11 = !bVar10;
    if (bVar10 || f_data == (uchar *)0x0) goto LAB_001825c3;
    if (size == 0) {
      __assert_fail("data != 0 && size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                    ,0x201,
                    "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                   );
    }
    if ((this->mWriteBuffer).bufferSize == 0) {
      local_e4 = 0;
      do {
        uVar3 = (ulong)(size - local_e4);
        if (size < local_e4 || size - local_e4 == 0) {
          __assert_fail("size > total",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x205,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
        if (resolver.addr == (sockaddr *)0x0) {
          do {
            sVar4 = ::write(this->mFd,f_data + local_e4,uVar3);
            iVar2 = (int)sVar4;
            e = iVar2;
            if (iVar2 != -1) goto LAB_00182685;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
        }
        else {
          do {
            sVar4 = sendto(this->mFd,f_data + local_e4,uVar3,0x4000,(sockaddr *)resolver.addr,
                           (socklen_t)resolver.size);
            iVar2 = (int)sVar4;
            e = iVar2;
            if (iVar2 != -1) goto LAB_00182685;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
        }
        iVar2 = -1;
LAB_00182685:
        if (this->mLogsEnabled == true) {
          debug();
          Log::operator<<(&local_80,local_90);
          Log::addStringStream<unsigned_int>(&local_70,(uint)&local_80);
          Log::operator<<(&local_c0,(char *)&local_70);
          Log::addStringStream<int>((Log *)&loop,(int)&local_c0);
          __errno_location();
          Log::addStringStream<int>(&local_50,(int)(Log *)&loop);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_c0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
          iVar2 = e;
        }
        if (iVar2 == -1) {
          piVar5 = __errno_location();
          if (*piVar5 != 0xb) {
            std::__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<SocketClient,void>
                      ((__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2> *)&loop,
                       (__weak_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2> *)this);
            local_c0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
                 5;
            pSVar7 = &loop;
            Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
            operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                        *)&this->mSignalError,(shared_ptr<SocketClient> *)pSVar7,(Error *)&local_c0)
            ;
            iVar2 = (int)pSVar7;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            close(this,iVar2);
            goto LAB_0018257c;
          }
          if (this->mWMode == Synchronous) {
            EventLoop::eventLoop();
            peVar1 = loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
LAB_00182874:
              bVar11 = false;
            }
            else {
              sVar8 = (this->mWriteBuffer).bufferSize + uVar3;
              if ((this->mMaxWriteBufferSize != 0) && (this->mMaxWriteBufferSize < sVar8)) {
                close(this,(int)sVar8);
                goto LAB_00182874;
              }
              Buffer::reserve(this_00,sVar8);
              memcpy((this->mWriteBuffer).bufferData + (this->mWriteBuffer).bufferSize,
                     f_data + local_e4,uVar3);
              Buffer::resize(this_00,uVar3 + (this->mWriteBuffer).bufferSize);
              if (this->mWriteOffset != 0) {
                __assert_fail("!mWriteOffset",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                              ,0x21e,
                              "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                             );
              }
              EventLoop::processSocket
                        (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         this->mFd,-1);
              bVar11 = this->mFd != -1;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            if (peVar1 != (element_type *)0x0) goto LAB_001825c3;
          }
          if (this->mWriteWait == true) {
            __assert_fail("!mWriteWait",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                          ,0x224,
                          "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                         );
          }
          EventLoop::eventLoop();
          if (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            EventLoop::updateSocket
                      (loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       this->mFd,7);
            this->mWriteWait = true;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          goto LAB_00182552;
        }
        Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>>::operator()
                  ((Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                   &this->mSignalBytesWritten,&socketPtr,&e);
        local_e4 = local_e4 + e;
        if (size < local_e4) {
          __assert_fail("total <= size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x233,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
      } while (local_e4 != size);
      bVar11 = true;
      goto LAB_001825c3;
    }
  }
LAB_00182552:
  bVar11 = true;
  uVar3 = (ulong)(size - local_e4);
  if (local_e4 <= size && size - local_e4 != 0) {
    sVar8 = (this->mWriteBuffer).bufferSize + uVar3;
    if ((this->mMaxWriteBufferSize == 0) || (sVar8 <= this->mMaxWriteBufferSize)) {
      Buffer::reserve(&this->mWriteBuffer,sVar8);
      memcpy((this->mWriteBuffer).bufferData + (this->mWriteBuffer).bufferSize,f_data + local_e4,
             uVar3);
      Buffer::resize(&this->mWriteBuffer,uVar3 + (this->mWriteBuffer).bufferSize);
    }
    else {
      close(this,(int)sVar8);
LAB_0018257c:
      bVar11 = false;
    }
  }
LAB_001825c3:
  Resolver::~Resolver(&resolver);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&socketPtr.super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar11;
}

Assistant:

bool SocketClient::writeTo(const String& host, uint16_t port, const unsigned char* f_data, unsigned int size)
{
#ifdef _WIN32
    const char *data = reinterpret_cast<const char*>(f_data);
#else
    const unsigned char *data = f_data;
#endif

#ifdef RCT_SOCKETCLIENT_TIMING_ENABLED
    if (size) {
        mWrites.append(size);
    }
#endif

    assert((!size) == (!data));
    SocketClient::SharedPtr socketPtr = shared_from_this();

    Resolver resolver;
    if (port != 0)
        resolver.resolve(host, port, socketPtr);

    int e;
    unsigned int total = 0;

#ifdef HAVE_NOSIGNAL
    const int sendFlags = MSG_NOSIGNAL;
#else
    const int sendFlags = 0;
#endif

    if (!mWriteWait) {
        if (!mWriteBuffer.isEmpty()) {
            // assert(mWriteOffset < mWriteBuffer.size());
            const size_t writeBufferSize = mWriteBuffer.size() - mWriteOffset;
            while (total < writeBufferSize) {
                assert(mWriteBuffer.size() > total);
                if (resolver.addr) {
                    eintrwrap(e, ::sendto(mFd, reinterpret_cast<const char*>(mWriteBuffer.data()) + total + mWriteOffset, writeBufferSize - total,
                                          sendFlags, resolver.addr, resolver.size));
                } else {
                    eintrwrap(e, ::write(mFd, mWriteBuffer.data() + total + mWriteOffset, writeBufferSize - total));
                }
                DEBUG() << "SENT(1)" << (writeBufferSize - total) << "BYTES" << e << errno;
                if (e == -1) {
                    if (errno == EAGAIN || errno == EWOULDBLOCK) {
                        if (mWMode == Synchronous) {
                            if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                                if (total) {
                                    if (total < writeBufferSize) {
                                        mWriteOffset += total;
                                    } else {
                                        mWriteOffset = 0;
                                        mWriteBuffer.clear();
                                    }
                                    total = 0;
                                }
                                if (loop->processSocket(mFd) & EventLoop::SocketWrite)
                                    break;
                                if (mFd == -1)
                                    return false;
                            }
                        }
                        assert(!mWriteWait);
                        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                            loop->updateSocket(mFd, EventLoop::SocketRead|EventLoop::SocketWrite|EventLoop::SocketOneShot);
                            mWriteWait = true;
                        }
                        break;
                    } else {
                        // bad
                        mSignalError(shared_from_this(), WriteError);
                        close();
                        return false;
                    }
                }
                mSignalBytesWritten(socketPtr, e);
                total += e;
            }
            if (total) {
                assert(total <= writeBufferSize);
                if (total < writeBufferSize) {
                    mWriteOffset += total;
                } else {
                    mWriteOffset = 0;
                    mWriteBuffer.clear();
                }
            }
        }

        if (mFd == -1 || !data) {
            return mFd != -1;
        }
        total = 0;

        assert(data != 0 && size > 0);

        if (mWriteBuffer.isEmpty()) {
            for (;;) {
                assert(size > total);
                if (resolver.addr) {
                    eintrwrap(e, ::sendto(mFd, data + total, size - total,
                                          sendFlags, resolver.addr, resolver.size));
                } else {
#ifdef _WIN32
                    eintrwrap(e, ::send(mFd, data + total, size - total, 0));
#else
                    eintrwrap(e, ::write(mFd, data + total, size - total));
#endif
                }
                DEBUG() << "SENT(2)" << (size - total) << "BYTES" << e << errno;
                if (e == -1) {
                    if (errno == EAGAIN || errno == EWOULDBLOCK) {
                        if (mWMode == Synchronous) {
                            if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                                // store the rest
                                const unsigned int rem = size - total;
                                if (mMaxWriteBufferSize && mWriteBuffer.size() + rem > mMaxWriteBufferSize) {
                                    close();
                                    return false;
                                }
                                mWriteBuffer.reserve(mWriteBuffer.size() + rem);
                                memcpy(mWriteBuffer.end(), data + total, rem);
                                mWriteBuffer.resize(mWriteBuffer.size() + rem);
                                assert(!mWriteOffset);

                                (void)loop->processSocket(mFd);
                                return isConnected();
                            }
                        }
                        assert(!mWriteWait);
                        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                            loop->updateSocket(mFd, EventLoop::SocketRead|EventLoop::SocketWrite|EventLoop::SocketOneShot);
                            mWriteWait = true;
                        }
                        break;
                    } else {
                        // bad
                        mSignalError(shared_from_this(), WriteError);
                        close();
                        return false;
                    }
                }
                mSignalBytesWritten(socketPtr, e);
                total += e;
                assert(total <= size);
                if (total == size) {
                    // we're done
                    return true;
                }
            }
        }
    }

    if (total < size) {
        // store the rest
        const unsigned int rem = size - total;
        if (mMaxWriteBufferSize && mWriteBuffer.size() + rem > mMaxWriteBufferSize) {
            close();
            return false;
        }
        mWriteBuffer.reserve(mWriteBuffer.size() + rem);
        memcpy(mWriteBuffer.end(), data + total, rem);
        mWriteBuffer.resize(mWriteBuffer.size() + rem);
    }
    return true;
}